

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertion_tests.c
# Opt level: O1

void null_string_should_only_match_another_null_string(void)

{
  Constraint_ *pCVar1;
  Constraint *constraint;
  
  assert_string_equal_
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/assertion_tests.c"
             ,0x103,"__null",0,0);
  assert_string_not_equal_
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/assertion_tests.c"
             ,0x104,"__null",0,"");
  assert_string_not_equal_
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/assertion_tests.c"
             ,0x105,"\"\"","",0);
  pCVar1 = (Constraint_ *)create_equal_to_string_constraint(0,"(char *)NULL");
  cgreen::assert_that_
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/assertion_tests.c"
             ,0x109,"(intptr_t)__null",0,pCVar1);
  pCVar1 = (Constraint_ *)create_not_equal_to_string_constraint("","\"\"");
  cgreen::assert_that_
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/assertion_tests.c"
             ,0x10a,"(intptr_t)__null",0,pCVar1);
  constraint = (Constraint *)create_not_equal_to_string_constraint(0,"(char *)NULL");
  cgreen::assert_that_<char_const*>
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/assertion_tests.c"
             ,0x10b,"\"\"","",constraint);
  return;
}

Assistant:

Ensure(null_string_should_only_match_another_null_string) {
    assert_string_equal(NULL, NULL);
    assert_string_not_equal(NULL, "");
    assert_string_not_equal("", NULL);

    // fluent syntax technically doesn't allow NULL on left-hand side
    // we force the issue to make sure we are testing both syntaxes
    assert_that((intptr_t)NULL, is_equal_to_string((char *)NULL));
    assert_that((intptr_t)NULL, is_not_equal_to_string(""));
    assert_that("", is_not_equal_to_string((char *)NULL));
}